

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void REVassoc_bridge_action_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  EVaction EVar1;
  CMFormat format;
  attr_list contact_list_00;
  long in_RDX;
  attr_list contact_list;
  CMFormat f;
  EVaction ret;
  EVassoc_bridge_action_request *request;
  EV_int_response response;
  undefined4 in_stack_ffffffffffffffa8;
  EVstone in_stack_ffffffffffffffac;
  CManager_conflict in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  format = CMlookup_format(in_stack_ffffffffffffffb0,
                           (FMStructDescList)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format((CManager)0x0,(FMStructDescList)in_stack_ffffffffffffffb0);
  }
  contact_list_00 = (attr_list)attr_list_from_string(*(undefined8 *)(in_RDX + 8));
  EVar1 = EVassoc_bridge_action
                    ((CManager_conflict)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (EVstone)((ulong)format >> 0x20),contact_list_00,in_stack_ffffffffffffffac);
  free_attr_list(contact_list_00);
  CMwrite((CMConnection)CONCAT44(EVar1,in_stack_ffffffffffffffc0),format,contact_list_00);
  return;
}

Assistant:

static void
REVassoc_bridge_action_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVassoc_bridge_action_request *request = (EVassoc_bridge_action_request *) data;
    EVaction ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    attr_list contact_list = attr_list_from_string(request->contact_list);
    ret = EVassoc_bridge_action(cm, request->stone, contact_list, request->remote_stone);
free_attr_list(contact_list);
    response.ret = (int) ret;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}